

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::reduction_op_keepdims<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  void *pvVar18;
  bool bVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  float fVar23;
  Mat mins;
  Mat local_78;
  
  sVar1 = a->elemsize;
  iVar22 = a->dims;
  if (iVar22 == 3) {
    uVar9 = a->w;
    uVar12 = (ulong)uVar9;
    uVar8 = a->h;
    uVar16 = (ulong)uVar8;
    uVar7 = a->c;
    uVar15 = (ulong)uVar7;
    uVar14 = uVar8 * uVar9;
    bVar19 = !reduce_w;
    bVar6 = !reduce_h;
    if ((bVar19 || bVar6) || !reduce_c) {
      if ((!bVar19 && !bVar6) && !reduce_c) {
        Mat::create(b,1,1,uVar7,sVar1,opt->blob_allocator);
        if (0 < (int)uVar7) {
          pvVar10 = a->data;
          sVar1 = a->cstep;
          pvVar13 = b->data;
          sVar2 = b->cstep;
          sVar3 = b->elemsize;
          sVar4 = a->elemsize;
          uVar12 = 0;
          do {
            fVar23 = 0.0;
            if (0 < (int)uVar14) {
              uVar16 = 0;
              do {
                fVar23 = fVar23 + *(float *)((long)pvVar10 + uVar16 * 4);
                uVar16 = uVar16 + 1;
              } while (uVar14 != uVar16);
            }
            *(float *)((long)pvVar13 + sVar2 * sVar3 * uVar12) = fVar23;
            uVar12 = uVar12 + 1;
            pvVar10 = (void *)((long)pvVar10 + sVar1 * sVar4);
          } while (uVar12 != uVar15);
          return 0;
        }
        return 0;
      }
      lVar11 = (long)(int)uVar9;
      if ((!bVar19 && !reduce_h) && !reduce_c) {
        Mat::create(b,1,uVar8,uVar7,sVar1,opt->blob_allocator);
        if (0 < (int)uVar7) {
          pvVar10 = a->data;
          sVar1 = a->cstep;
          sVar2 = b->cstep;
          sVar3 = b->elemsize;
          sVar4 = a->elemsize;
          pvVar13 = b->data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar20 = 0;
              pvVar18 = pvVar10;
              do {
                fVar23 = 0.0;
                if (0 < (int)uVar9) {
                  uVar21 = 0;
                  do {
                    fVar23 = fVar23 + *(float *)((long)pvVar18 + uVar21 * 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar12 != uVar21);
                }
                *(float *)((long)pvVar13 + uVar20 * 4 + sVar2 * sVar3 * uVar17) = fVar23;
                uVar20 = uVar20 + 1;
                pvVar18 = (void *)((long)pvVar18 + lVar11 * 4);
              } while (uVar20 != uVar16);
            }
            uVar17 = uVar17 + 1;
            pvVar10 = (void *)((long)pvVar10 + sVar1 * sVar4);
          } while (uVar17 != uVar15);
          return 0;
        }
        return 0;
      }
      if ((!bVar19 && !reduce_h) && reduce_c) {
        Mat::create(b,1,uVar8,1,sVar1,opt->blob_allocator);
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        Mat::create(&local_78,1,uVar8,uVar7,sVar1,opt->workspace_allocator);
        pvVar10 = local_78.data;
        iVar22 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_00202100;
        uVar14 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar14) {
          memset(local_78.data,0,(ulong)uVar14 << 2);
        }
        if (0 < (int)uVar7) {
          sVar1 = a->cstep;
          sVar2 = a->elemsize;
          pvVar13 = a->data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar20 = 0;
              pvVar18 = pvVar13;
              do {
                fVar23 = 0.0;
                if (0 < (int)uVar9) {
                  uVar21 = 0;
                  do {
                    fVar23 = fVar23 + *(float *)((long)pvVar18 + uVar21 * 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar12 != uVar21);
                }
                *(float *)((long)pvVar10 +
                          uVar20 * 4 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * uVar17)
                     = fVar23;
                uVar20 = uVar20 + 1;
                pvVar18 = (void *)((long)pvVar18 + lVar11 * 4);
              } while (uVar20 != uVar16);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar1 * sVar2);
          } while (uVar17 != uVar15);
        }
        uVar9 = b->c * (int)b->cstep;
        if (0 < (int)uVar9) {
          memset(b->data,0,(ulong)uVar9 << 2);
        }
        if (0 < (int)uVar7) {
          pvVar10 = b->data;
          uVar12 = 0;
          pvVar13 = local_78.data;
          do {
            if (0 < (int)uVar8) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar10 + uVar17 * 4) =
                     *(float *)((long)pvVar13 + uVar17 * 4) + *(float *)((long)pvVar10 + uVar17 * 4)
                ;
                uVar17 = uVar17 + 1;
              } while (uVar16 != uVar17);
            }
            uVar12 = uVar12 + 1;
            pvVar13 = (void *)((long)pvVar13 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar12 != uVar15);
        }
      }
      else {
        if ((bVar6 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar9,uVar8,1,sVar1,opt->blob_allocator);
            uVar9 = b->c * (int)b->cstep;
            if (0 < (int)uVar9) {
              memset(b->data,0,(ulong)uVar9 << 2);
            }
            if (0 < (int)uVar7) {
              sVar1 = a->cstep;
              sVar2 = a->elemsize;
              pvVar10 = a->data;
              pvVar13 = b->data;
              uVar12 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar16 = 0;
                  do {
                    *(float *)((long)pvVar13 + uVar16 * 4) =
                         *(float *)((long)pvVar10 + uVar16 * 4) +
                         *(float *)((long)pvVar13 + uVar16 * 4);
                    uVar16 = uVar16 + 1;
                  } while (uVar14 != uVar16);
                }
                uVar12 = uVar12 + 1;
                pvVar10 = (void *)((long)pvVar10 + sVar1 * sVar2);
              } while (uVar12 != uVar15);
              return 0;
            }
            return 0;
          }
          if ((bVar6 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar9,1,uVar7,sVar1,opt->blob_allocator);
          sVar1 = b->cstep;
          uVar14 = b->c * (int)sVar1;
          if (0 < (int)uVar14) {
            memset(b->data,0,(ulong)uVar14 << 2);
          }
          if (0 < (int)uVar7) {
            pvVar10 = a->data;
            sVar2 = a->cstep;
            pvVar13 = b->data;
            sVar3 = a->elemsize;
            sVar4 = b->elemsize;
            uVar16 = 0;
            do {
              if (0 < (int)uVar8) {
                uVar7 = 0;
                pvVar18 = pvVar10;
                do {
                  if (0 < (int)uVar9) {
                    uVar17 = 0;
                    do {
                      *(float *)((long)pvVar13 + uVar17 * 4) =
                           *(float *)((long)pvVar18 + uVar17 * 4) +
                           *(float *)((long)pvVar13 + uVar17 * 4);
                      uVar17 = uVar17 + 1;
                    } while (uVar12 != uVar17);
                  }
                  uVar7 = uVar7 + 1;
                  pvVar18 = (void *)((long)pvVar18 + lVar11 * 4);
                } while (uVar7 != uVar8);
              }
              uVar16 = uVar16 + 1;
              pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
              pvVar13 = (void *)((long)pvVar13 + sVar1 * sVar4);
            } while (uVar16 != uVar15);
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar9,1,1,sVar1,opt->blob_allocator);
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        Mat::create(&local_78,uVar9,1,uVar7,sVar1,opt->workspace_allocator);
        pvVar10 = local_78.data;
        iVar22 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_00202100;
        uVar14 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar14) {
          memset(local_78.data,0,(ulong)uVar14 << 2);
        }
        if (0 < (int)uVar7) {
          pvVar13 = a->data;
          sVar1 = a->cstep;
          sVar2 = a->elemsize;
          uVar16 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar14 = 0;
              pvVar18 = pvVar13;
              do {
                if (0 < (int)uVar9) {
                  uVar17 = 0;
                  do {
                    *(float *)((long)pvVar10 + uVar17 * 4) =
                         *(float *)((long)pvVar18 + uVar17 * 4) +
                         *(float *)((long)pvVar10 + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar12 != uVar17);
                }
                uVar14 = uVar14 + 1;
                pvVar18 = (void *)((long)pvVar18 + lVar11 * 4);
              } while (uVar14 != uVar8);
            }
            uVar16 = uVar16 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar1 * sVar2);
            pvVar10 = (void *)((long)pvVar10 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar16 != uVar15);
        }
        uVar8 = b->c * (int)b->cstep;
        if (0 < (int)uVar8) {
          memset(b->data,0,(ulong)uVar8 << 2);
        }
        if (0 < (int)uVar7) {
          pvVar10 = b->data;
          uVar16 = 0;
          pvVar13 = local_78.data;
          do {
            if (0 < (int)uVar9) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar10 + uVar17 * 4) =
                     *(float *)((long)pvVar13 + uVar17 * 4) + *(float *)((long)pvVar10 + uVar17 * 4)
                ;
                uVar17 = uVar17 + 1;
              } while (uVar12 != uVar17);
            }
            uVar16 = uVar16 + 1;
            pvVar13 = (void *)((long)pvVar13 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar16 != uVar15);
        }
      }
      iVar22 = 0;
LAB_00202100:
      Mat::~Mat(&local_78);
      return iVar22;
    }
    Mat::create(b,1,1,1,sVar1,opt->blob_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,uVar7,sVar1,opt->workspace_allocator);
    iVar22 = -100;
    if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      if ((int)uVar7 < 1) {
LAB_00201d99:
        fVar23 = 0.0;
      }
      else {
        pvVar10 = a->data;
        sVar1 = a->cstep;
        sVar2 = a->elemsize;
        uVar12 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar14) {
            uVar16 = 0;
            do {
              fVar23 = fVar23 + *(float *)((long)pvVar10 + uVar16 * 4);
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
          }
          *(float *)((long)local_78.data + uVar12 * 4) = fVar23;
          uVar12 = uVar12 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar1 * sVar2);
        } while (uVar12 != uVar15);
        if ((int)uVar7 < 1) goto LAB_00201d99;
        fVar23 = 0.0;
        uVar12 = 0;
        do {
          fVar23 = fVar23 + *(float *)((long)local_78.data + uVar12 * 4);
          uVar12 = uVar12 + 1;
        } while (uVar15 != uVar12);
      }
      *(float *)b->data = fVar23;
      iVar22 = 0;
    }
    piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return iVar22;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return iVar22;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return iVar22;
    }
    goto LAB_00201dd7;
  }
  if (iVar22 != 2) {
    if (iVar22 == 1) {
      iVar22 = a->w;
      Mat::create(b,1,sVar1,opt->blob_allocator);
      if ((long)iVar22 < 1) {
        fVar23 = 0.0;
      }
      else {
        fVar23 = 0.0;
        lVar11 = 0;
        do {
          fVar23 = fVar23 + *(float *)((long)a->data + lVar11 * 4);
          lVar11 = lVar11 + 1;
        } while (iVar22 != lVar11);
      }
      *(float *)b->data = fVar23;
      return 0;
    }
    return 0;
  }
  uVar9 = a->w;
  uVar12 = (ulong)uVar9;
  uVar8 = a->h;
  uVar15 = (ulong)uVar8;
  if (!reduce_w || !reduce_h) {
    if (reduce_w && !reduce_h) {
      Mat::create(b,1,uVar8,sVar1,opt->blob_allocator);
      if (0 < (int)uVar8) {
        pvVar10 = a->data;
        iVar22 = a->w;
        sVar1 = a->elemsize;
        pvVar13 = b->data;
        uVar16 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar9) {
            uVar17 = 0;
            do {
              fVar23 = fVar23 + *(float *)((long)pvVar10 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar12 != uVar17);
          }
          *(float *)((long)pvVar13 + uVar16 * 4) = fVar23;
          uVar16 = uVar16 + 1;
          pvVar10 = (void *)((long)pvVar10 + (long)iVar22 * sVar1);
        } while (uVar16 != uVar15);
        return 0;
      }
      return 0;
    }
    if (!reduce_h || reduce_w) {
      return 0;
    }
    Mat::create(b,uVar9,1,sVar1,opt->blob_allocator);
    uVar7 = b->c * (int)b->cstep;
    if (0 < (int)uVar7) {
      memset(b->data,0,(ulong)uVar7 << 2);
    }
    if (0 < (int)uVar8) {
      pvVar10 = a->data;
      iVar22 = a->w;
      sVar1 = a->elemsize;
      pvVar13 = b->data;
      uVar16 = 0;
      do {
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 *(float *)((long)pvVar10 + uVar17 * 4) + *(float *)((long)pvVar13 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar12 != uVar17);
        }
        uVar16 = uVar16 + 1;
        pvVar10 = (void *)((long)pvVar10 + (long)iVar22 * sVar1);
      } while (uVar16 != uVar15);
      return 0;
    }
    return 0;
  }
  Mat::create(b,1,1,sVar1,opt->blob_allocator);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,uVar8,sVar1,opt->workspace_allocator);
  iVar22 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    if ((int)uVar8 < 1) {
LAB_00201d5a:
      fVar23 = 0.0;
    }
    else {
      pvVar10 = a->data;
      iVar22 = a->w;
      sVar1 = a->elemsize;
      uVar16 = 0;
      do {
        fVar23 = 0.0;
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            fVar23 = fVar23 + *(float *)((long)pvVar10 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar12 != uVar17);
        }
        *(float *)((long)local_78.data + uVar16 * 4) = fVar23;
        uVar16 = uVar16 + 1;
        pvVar10 = (void *)((long)pvVar10 + (long)iVar22 * sVar1);
      } while (uVar16 != uVar15);
      if ((int)uVar8 < 1) goto LAB_00201d5a;
      fVar23 = 0.0;
      uVar12 = 0;
      do {
        fVar23 = fVar23 + *(float *)((long)local_78.data + uVar12 * 4);
        uVar12 = uVar12 + 1;
      } while (uVar15 != uVar12);
    }
    *(float *)b->data = fVar23;
    iVar22 = 0;
  }
  piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar5 == (int *)0x0) {
    return iVar22;
  }
  LOCK();
  *piVar5 = *piVar5 + -1;
  UNLOCK();
  if (*piVar5 != 0) {
    return iVar22;
  }
  if (local_78.allocator != (Allocator *)0x0) {
    (*(local_78.allocator)->_vptr_Allocator[3])();
    return iVar22;
  }
LAB_00201dd7:
  if (local_78.data != (void *)0x0) {
    free(local_78.data);
  }
  return iVar22;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}